

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolARP.cpp
# Opt level: O1

int __thiscall ProtocolARP::LocateProtocolAddress(ProtocolARP *this,uint8_t *protocolAddress)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  
  lVar6 = 0;
  do {
    sVar3 = ProtocolIPv4::AddressSize(this->IP);
    uVar4 = sVar3 & 0xffffffff;
    iVar5 = (int)sVar3 + -1;
    if (-2 < iVar5) {
      iVar5 = -1;
    }
    iVar1 = (int)sVar3 + 1;
    do {
      uVar4 = uVar4 - 1;
      iVar2 = iVar5 + 1;
      if ((int)(uint)uVar4 < 0) break;
      uVar7 = (uint)uVar4 & 0x7fffffff;
      iVar1 = iVar1 + -1;
      iVar2 = iVar1;
    } while (this->Cache[lVar6].IPv4Address[uVar7] == protocolAddress[uVar7]);
    if (iVar2 == 0) goto LAB_00105aa7;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 5);
  lVar6 = 0xffffffff;
LAB_00105aa7:
  return (int)lVar6;
}

Assistant:

int ProtocolARP::LocateProtocolAddress(const uint8_t* protocolAddress)
{
    int i;
    int j;

    for (i = 0; i < ARPCacheSize; i++)
    {
        // Go through the address backwards since least significant byte is most
        // likely to be unique
        for (j = IP.AddressSize() - 1; j >= 0; j--)
        {
            if (Cache[i].IPv4Address[j] != protocolAddress[j])
            {
                break;
            }
        }
        if (j == -1)
        {
            // found
            return i;
        }
    }

    return -1;
}